

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

bool __thiscall
ColumnSampler<double>::sample_col
          (ColumnSampler<double> *this,size_t *col,Xoshiro256PP *rnd_generator)

{
  double *pdVar1;
  pointer pdVar2;
  long lVar3;
  result_type rVar4;
  size_t lev;
  ulong uVar5;
  size_t sVar6;
  result_type_conflict1 rVar7;
  uniform_real_distribution<double> local_40;
  
  pdVar1 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 == (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    sVar6 = this->curr_pos;
    if (sVar6 == 0) {
      return false;
    }
    if (sVar6 == 1) {
      this->last_given = 0;
      sVar6 = *(this->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      local_40._M_param._M_b = (double)(sVar6 - 1);
      local_40._M_param._M_a = 0.0;
      rVar4 = std::uniform_int_distribution<unsigned_long>::operator()
                        ((uniform_int_distribution<unsigned_long> *)&local_40,rnd_generator);
      this->last_given = rVar4;
      sVar6 = (this->col_indices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[rVar4];
    }
  }
  else {
    local_40._M_param._M_b = *pdVar1;
    if (local_40._M_param._M_b <= 0.0) {
      return false;
    }
    lVar3 = 0;
    for (uVar5 = 0; uVar5 < this->tree_levels; uVar5 = uVar5 + 1) {
      local_40._M_param._M_a = 0.0;
      rVar7 = std::uniform_real_distribution<double>::operator()(&local_40,rnd_generator);
      pdVar2 = (this->tree_weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = (lVar3 * 2 + 2) - (ulong)(rVar7 < pdVar2[lVar3 * 2 + 1]);
      local_40._M_param._M_b = pdVar2[lVar3];
    }
    sVar6 = lVar3 - this->offset;
  }
  *col = sVar6;
  return true;
}

Assistant:

bool ColumnSampler<ldouble_safe>::sample_col(size_t &col, RNG_engine &rnd_generator)
{
    if (!this->has_weights())
    {
        switch(this->curr_pos)
        {
            case 0: return false;
            case 1:
            {
                this->last_given = 0;
                col = this->col_indices[0];
                return true;
            }
            default:
            {
                this->last_given = std::uniform_int_distribution<size_t>(0, this->curr_pos-1)(rnd_generator);
                col = this->col_indices[this->last_given];
                return true;
            }
        }
    }

    else
    {
        /* TODO: here could instead generate only 1 random number from zero to the full weight,
           and then subtract from it as it goes down every level. Would have less precision
           but should still work fine. */
        size_t curr_ix = 0;
        double rnd_subrange, w_left;
        double curr_subrange = this->tree_weights[0];
        if (curr_subrange <= 0)
            return false;

        for (size_t lev = 0; lev < tree_levels; lev++)
        {
            rnd_subrange = std::uniform_real_distribution<double>(0., curr_subrange)(rnd_generator);
            w_left = this->tree_weights[ix_child(curr_ix)];
            curr_ix = ix_child(curr_ix) + (rnd_subrange >= w_left);
            curr_subrange = this->tree_weights[curr_ix];
        }

        col = curr_ix - this->offset;
        return true;
    }
}